

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O1

void prsvgf0(void *ctx0,toksdef *sym)

{
  uchar uVar1;
  ushort uVar2;
  emtcxdef *ctx;
  uint16_t tmp;
  
  ctx = *(emtcxdef **)((long)ctx0 + 0x28);
  emtres(ctx,2);
  *(ushort *)(ctx->emtcxptr + ctx->emtcxofs) = sym->toksval;
  ctx->emtcxofs = ctx->emtcxofs + 2;
  emtres(ctx,1);
  uVar1 = sym->tokslen;
  uVar2 = ctx->emtcxofs;
  ctx->emtcxofs = uVar2 + 1;
  ctx->emtcxptr[uVar2] = uVar1;
  emtres(ctx,(ushort)sym->tokslen);
  memcpy(ctx->emtcxptr + ctx->emtcxofs,sym->toksnam,(ulong)sym->tokslen);
  ctx->emtcxofs = ctx->emtcxofs + (ushort)sym->tokslen;
  return;
}

Assistant:

static void prsvgf0(void *ctx0, toksdef *sym)
{
    prscxdef *ctx = (prscxdef *)ctx0;
    emtcxdef *ec = ctx->prscxemt;

    /* write out value (offset from base ptr) and name of symbol */
    emtint2(ec, sym->toksval);
    emtbyte(ec, sym->tokslen);
    emtmem(ec, sym->toksnam, (size_t)sym->tokslen);
}